

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O1

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::ObjectCache::Get<duckdb::ParquetFileMetadataCache>(ObjectCache *this,string *key)

{
  undefined8 uVar1;
  int iVar2;
  ObjectCacheEntry *pOVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  bool bVar5;
  shared_ptr<duckdb::ObjectCacheEntry,_true> sVar6;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar7;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  size_type __dnew;
  undefined1 local_80 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50 [2];
  undefined8 local_40;
  undefined8 local_38 [2];
  undefined1 local_28 [16];
  undefined8 uVar4;
  
  sVar6 = GetObject((ObjectCache *)local_80,key);
  uVar1 = local_80._0_8_;
  bVar5 = true;
  uVar4 = sVar6.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((_Hash_node_base *)local_80._0_8_ != (_Hash_node_base *)0x0) {
    pOVar3 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                       ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_80);
    (*pOVar3->_vptr_ObjectCacheEntry[2])(local_38,pOVar3);
    local_60 = local_50;
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10;
    local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ::std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
    local_50[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
    *local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5f74657571726170;
    local_60[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x617461646174656d;
    local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
    *(char *)((long)local_60 + local_40) = '\0';
    uVar4 = local_38[1];
    if (local_38[1] == local_40) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38[1] ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar5 = false;
      }
      else {
        iVar2 = bcmp((void *)local_38[0],local_60,local_38[1]);
        bVar5 = iVar2 != 0;
        uVar4 = extraout_RDX;
      }
    }
  }
  if ((_Hash_node_base *)uVar1 != (_Hash_node_base *)0x0) {
    if (local_60 != local_50) {
      operator_delete(local_60);
      uVar4 = extraout_RDX_00;
    }
    if ((undefined1 *)local_38[0] != local_28) {
      operator_delete((void *)local_38[0]);
      uVar4 = extraout_RDX_01;
    }
  }
  if (bVar5) {
    (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->cache)._M_h._M_bucket_count = 0;
  }
  else {
    local_80._16_8_ = local_80._0_8_;
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
      }
    }
    sVar7 = shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetFileMetadataCache>
                      ((duckdb *)this,
                       (shared_ptr<duckdb::ObjectCacheEntry,_true> *)(local_80 + 0x10));
    uVar4 = sVar7.internal.
            super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      uVar4 = extraout_RDX_02;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    uVar4 = extraout_RDX_03;
  }
  sVar7.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  sVar7.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar7.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> Get(const string &key) {
		shared_ptr<ObjectCacheEntry> object = GetObject(key);
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}